

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O0

void (anonymous_namespace)::ColorGradientRGB::alphaGrad<3u,4u>(uint32_t *pixBack,uint32_t pixFront)

{
  uint32_t uVar1;
  uint32_t pixFront_local;
  uint32_t *pixBack_local;
  
  uVar1 = gradientRGB<3u,4u>(pixFront,*pixBack);
  *pixBack = uVar1;
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront)
    {
        pixBack = gradientRGB<M, N>(pixFront, pixBack);
    }